

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O0

Relations dg::vr::RelationsAnalyzer::getCommonByPointedTo<llvm::Value_const*>
                    (VectorSet<const_llvm::Value_*> *froms,
                    vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                    *changeLocations,Value **val,Relations rels)

{
  bool bVar1;
  Bucket *from_00;
  Bucket *pBVar2;
  HandlePtr pBVar3;
  Handle this;
  bitset<12UL> in_RCX;
  ValueRelations *in_RDX;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RSI;
  Handle loaded;
  HandlePtr from;
  ValueRelations *graph;
  uint i;
  _Base_bitset<1UL> in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  _Base_bitset<1UL> local_8;
  
  uVar4 = 1;
  while( true ) {
    from_00 = (Bucket *)(ulong)uVar4;
    pBVar2 = (Bucket *)
             std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
             size(in_RSI);
    if (pBVar2 <= from_00) {
      return (Relations)in_RCX.super__Base_bitset<1UL>._M_w;
    }
    std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::operator[]
              (in_RSI,(ulong)uVar4);
    pBVar3 = getCorrespondingByContent
                       (in_RDX,(VectorSet<const_llvm::Value_*> *)
                               CONCAT44(uVar4,in_stack_ffffffffffffffd0));
    if (pBVar3 == (HandlePtr)0x0) break;
    this = ValueRelations::getPointedTo<dg::vr::Bucket>
                     ((ValueRelations *)in_stack_ffffffffffffffb0._M_w,from_00);
    in_stack_ffffffffffffffb0._M_w =
         (_WordT)ValueRelations::between<dg::vr::Bucket,llvm::Value_const*>
                           ((ValueRelations *)this,in_stack_ffffffffffffffb0._M_w,(Value **)from_00)
    ;
    Relations::operator&=((Relations *)in_stack_ffffffffffffffb0._M_w,(Relations *)from_00);
    bVar1 = Relations::any((Relations *)0x1d7c6d);
    if (!bVar1) {
      return (Relations)in_RCX.super__Base_bitset<1UL>._M_w._M_w;
    }
    uVar4 = uVar4 + 1;
  }
  memset(&local_8,0,8);
  Relations::Relations((Relations *)0x1d7c25);
  return (Relations)local_8._M_w;
}

Assistant:

static Relations
    getCommonByPointedTo(const VectorSet<V> &froms,
                         const std::vector<const VRLocation *> &changeLocations,
                         const X &val, Relations rels) {
        for (unsigned i = 1; i < changeLocations.size(); ++i) {
            const ValueRelations &graph = changeLocations[i]->relations;
            HandlePtr from = getCorrespondingByContent(graph, froms);
            if (!from)
                return Relations();
            assert(graph.hasLoad(*from));
            Handle loaded = graph.getPointedTo(*from);

            rels &= graph.between(loaded, val);
            if (!rels.any())
                break;
        }
        return rels;
    }